

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string_view value;
  string_view value_00;
  ostream *poVar1;
  NotifyToken<int> *pNVar2;
  string_view bucket;
  string_view payload;
  string_view bucket_00;
  string_view bucket_01;
  string_view bucket_02;
  string_view bucket_03;
  string_view bucket_04;
  shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sVar3;
  shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  sVar4;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  shared_ptr<mini_bus::BasicConnectionInfo> info;
  long *local_1698;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1690;
  io_service service;
  NotifyToken<int> tok_1;
  NotifyToken<int> tok;
  __shared_ptr<mini_bus::ConnectionInfo,(__gnu_cxx::_Lock_policy)2> local_1578 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1570;
  _Any_data local_1568;
  code *local_1558;
  code *local_1550;
  _Any_data local_1548;
  code *local_1538;
  code *local_1530;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1508;
  MiniBusClient client;
  
  boost::asio::io_context::io_context(&service);
  boost::asio::ip::make_address((address *)&client,"127.0.0.1");
  boost::asio::ip::detail::endpoint::endpoint((endpoint *)&tok,(address *)&client,0xfc8);
  std::
  make_shared<mini_bus::BasicConnectionInfo,boost::asio::io_context&,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
            ((io_context *)&info,(basic_endpoint<boost::asio::ip::tcp> *)&service);
  std::__shared_ptr<mini_bus::ConnectionInfo,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mini_bus::BasicConnectionInfo,void>
            (local_1578,
             &info.super___shared_ptr<mini_bus::BasicConnectionInfo,_(__gnu_cxx::_Lock_policy)2>);
  mini_bus::MiniBusClient::MiniBusClient(&client,(shared_ptr<mini_bus::ConnectionInfo> *)local_1578)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1570);
  (**(code **)(*(long *)((info.
                          super___shared_ptr<mini_bus::BasicConnectionInfo,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->token).
                        super___shared_ptr<mini_bus::NotifyToken<void>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x10))();
  poVar1 = std::operator<<((ostream *)&std::cout,"connected");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_1548._M_unused._M_object = (void *)0x0;
  local_1548._8_8_ = 0;
  local_1530 = std::
               _Function_handler<void_(std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/codehz[P]mini_bus_cpp/src/demo.cpp:17:37)>
               ::_M_invoke;
  local_1538 = std::
               _Function_handler<void_(std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/codehz[P]mini_bus_cpp/src/demo.cpp:17:37)>
               ::_M_manager;
  bucket._M_str = "shared";
  bucket._M_len = 6;
  key._M_str = "key";
  key._M_len = 3;
  mini_bus::MiniBusClient::observe
            (&client,bucket,key,
             (function<void_(std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>)>
              *)&local_1548);
  std::_Function_base::~_Function_base((_Function_base *)&local_1548);
  tok.super_INotifyToken<int>.super_IBaseNotifyToken<int>._vptr_IBaseNotifyToken =
       (IBaseNotifyToken<int>)((long)&tok.mtx.super___mutex_base._M_mutex + 8);
  std::__cxx11::string::_M_construct((ulong)&tok,'\0');
  payload._M_str = (char *)tok.mtx.super___mutex_base._M_mutex.__align;
  payload._M_len = (size_t)&client;
  mini_bus::MiniBusClient::ping((MiniBusClient *)&tok_1,payload);
  (**(code **)(*(long *)tok_1.super_INotifyToken<int>.super_IBaseNotifyToken<int>.
                        _vptr_IBaseNotifyToken + 0x10))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tok_1.mtx);
  std::__cxx11::string::~string((string *)&tok);
  value._M_str = "value";
  value._M_len = 5;
  bucket_00._M_str = (char *)0x6;
  bucket_00._M_len = (size_t)&client;
  key_00._M_str = (char *)0x3;
  key_00._M_len = (size_t)"shared";
  mini_bus::MiniBusClient::set((MiniBusClient *)&tok,bucket_00,key_00,value);
  (**(code **)(*(long *)tok.super_INotifyToken<int>.super_IBaseNotifyToken<int>.
                        _vptr_IBaseNotifyToken + 0x10))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tok.mtx);
  poVar1 = std::operator<<((ostream *)&std::cout,"v: ");
  bucket_01._M_str = (char *)0x6;
  bucket_01._M_len = (size_t)&client;
  key_01._M_str = (char *)0x3;
  key_01._M_len = (size_t)"shared";
  sVar3 = mini_bus::MiniBusClient::get_abi_cxx11_((MiniBusClient *)&tok_1,bucket_01,key_01);
  (**(code **)(*(long *)tok_1.super_INotifyToken<int>.super_IBaseNotifyToken<int>.
                        _vptr_IBaseNotifyToken + 0x10))
            (&tok,tok_1.super_INotifyToken<int>.super_IBaseNotifyToken<int>._vptr_IBaseNotifyToken,
             sVar3.
             super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._M_pi);
  poVar1 = std::operator<<(poVar1,(string *)&tok);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&tok);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tok_1.mtx);
  poVar1 = std::operator<<((ostream *)&std::cout,"here");
  std::endl<char,std::char_traits<char>>(poVar1);
  bucket_02._M_str = (char *)0x6;
  bucket_02._M_len = (size_t)&client;
  sVar4 = mini_bus::MiniBusClient::keys_abi_cxx11_((MiniBusClient *)&tok_1,bucket_02);
  (**(code **)(*(long *)tok_1.super_INotifyToken<int>.super_IBaseNotifyToken<int>.
                        _vptr_IBaseNotifyToken + 0x10))
            (&tok,tok_1.super_INotifyToken<int>.super_IBaseNotifyToken<int>._vptr_IBaseNotifyToken,
             sVar4.
             super___shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._M_pi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tok_1.mtx);
  pNVar2 = &tok;
  while (pNVar2 = *(NotifyToken<int> **)&pNVar2->super_INotifyToken<int>, pNVar2 != &tok) {
    poVar1 = std::operator<<((ostream *)&std::cout,"kv: ");
    poVar1 = std::operator<<(poVar1,(string *)((long)&pNVar2->mtx + 8));
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&pNVar2->cv);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::
  _List_base<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_clear((_List_base<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&tok);
  local_1568._M_unused._M_object = (void *)0x0;
  local_1568._8_8_ = 0;
  local_1550 = std::
               _Function_handler<void_(std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/codehz[P]mini_bus_cpp/src/demo.cpp:29:36)>
               ::_M_invoke;
  local_1558 = std::
               _Function_handler<void_(std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/codehz[P]mini_bus_cpp/src/demo.cpp:29:36)>
               ::_M_manager;
  mini_bus::MiniBusClient::listen(&client,4,0x11306f);
  std::_Function_base::~_Function_base((_Function_base *)&local_1568);
  mini_bus::NotifyToken<int>::NotifyToken(&tok);
  bucket_03._M_str = (char *)0x8;
  bucket_03._M_len = (size_t)&client;
  key_02._M_str = (char *)0x4;
  key_02._M_len = (size_t)"registry";
  sVar3 = mini_bus::MiniBusClient::get_abi_cxx11_((MiniBusClient *)&tok_1,bucket_03,key_02);
  (**(code **)(*(long *)tok_1.super_INotifyToken<int>.super_IBaseNotifyToken<int>.
                        _vptr_IBaseNotifyToken + 0x10))
            (&local_1508,
             tok_1.super_INotifyToken<int>.super_IBaseNotifyToken<int>._vptr_IBaseNotifyToken,
             sVar3.
             super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._M_pi);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_1508);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tok_1.mtx);
  poVar1 = std::operator<<((ostream *)&std::cout,"call");
  value_00._M_str = "boom";
  value_00._M_len = 4;
  bucket_04._M_str = (char *)0x4;
  bucket_04._M_len = (size_t)&client;
  key_03._M_str = (char *)0x4;
  key_03._M_len = (size_t)"demo";
  sVar3 = mini_bus::MiniBusClient::call_abi_cxx11_
                    ((MiniBusClient *)&local_1698,bucket_04,key_03,value_00);
  (**(code **)(*local_1698 + 0x10))
            (&tok_1,local_1698,
             sVar3.
             super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._M_pi);
  poVar1 = std::operator<<(poVar1,(string *)&tok_1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&tok_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1690);
  tok_1.super_INotifyToken<int>.super_IBaseNotifyToken<int>._vptr_IBaseNotifyToken =
       (IBaseNotifyToken<int>)(_func_int **)0xa;
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>((duration<long,_std::ratio<1L,_1L>_> *)&tok_1)
  ;
  mini_bus::NotifyToken<int>::~NotifyToken(&tok);
  mini_bus::MiniBusClient::~MiniBusClient(&client);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&info.super___shared_ptr<mini_bus::BasicConnectionInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  boost::asio::execution_context::~execution_context(&service.super_execution_context);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  using namespace mini_bus;
  using namespace std::chrono_literals;
  try {
    io_service service;
    auto info =
        std::make_shared<BasicConnectionInfo>(service, ip::tcp::endpoint{ip::address::from_string("127.0.0.1"), 4040});
    MiniBusClient client{info};
    info->wait();
    std::cout << "connected" << std::endl;

    client.observe("shared", "key", [](auto sv) {
      if (sv) std::cout << "update: " << *sv << std::endl;
    });

    client.ping(std::string(1024, 'a'))->wait();
    client.set("shared", "key", "value")->wait();
    std::cout << "v: " << *client.get("shared", "key")->wait() << std::endl;

    std::cout << "here" << std::endl;

    for (auto &[k, v] : client.keys("shared")->wait()) { std::cout << "kv: " << v << (int) k << std::endl; }

    client.listen("demo", "event", [](auto data) {
      if (data) std::cout << "event: " << *data << std::endl;
    });

    NotifyToken<int> tok;

    try {
      client.get("registry", "demo")->wait();
    } catch (...) {
      std::cout << "waiting" << std::endl;
      NotifyToken<int> tok;
      client.observe("registry", "demo", [&](auto sv) { tok.notify(0); });
      tok.wait();
    }

    std::cout << "call" << *client.call("demo", "echo", "boom")->wait() << std::endl;

    std::this_thread::sleep_for(10s);
  } catch (std::exception &e) { std::cout << e.what() << std::endl; }
}